

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

size_t hex2binary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  strfirst,
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 strlast,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         first,
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 last)

{
  byte bVar1;
  bool bVar2;
  reference pcVar3;
  byte *pbVar4;
  size_t sVar5;
  bool local_59;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  int local_44;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_40;
  int n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  i;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> o;
  value_type word;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_28;
  int shift;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  strlast_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  strfirst_local;
  
  o._M_current._4_4_ = 0;
  o._M_current._3_1_ = 0;
  _Stack_40._M_current = strfirst._M_current;
  i._M_current = (char *)first._M_current;
  _Stack_28._M_current = last._M_current;
  last_local._M_current = first._M_current;
  first_local._M_current = (uchar *)strlast._M_current;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&stack0xffffffffffffffc0,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&first_local);
    local_59 = false;
    if (bVar2) {
      local_59 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&i,&stack0xffffffffffffffd8);
    }
    if (local_59 == false) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&stack0xffffffffffffffc0);
    local_44 = char2nyble<char>(*pcVar3);
    if ((-1 < local_44) && (local_44 < 0x10)) {
      bVar1 = (byte)local_44;
      if (o._M_current._4_4_ != 0) {
        bVar1 = o._M_current._3_1_ << 4 | (byte)local_44;
      }
      o._M_current._3_1_ = bVar1;
      o._M_current._4_4_ = o._M_current._4_4_ + 4;
      if (o._M_current._4_4_ == 8) {
        local_50 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)&i,0);
        pbVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_50);
        *pbVar4 = o._M_current._3_1_;
        o._M_current._4_4_ = 0;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&stack0xffffffffffffffc0,0);
  }
  sVar5 = __gnu_cxx::operator-
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&i,&last_local);
  return sVar5;
}

Assistant:

size_t hex2binary(P1 strfirst, P1 strlast, P2 first, P2 last)
{
    int shift=0;
    typename std::iterator_traits<P2>::value_type word=0;
    P2 o= first;
    for (P1 i= strfirst ; i!=strlast && o!=last ; i++)
    {
        int n= char2nyble(*i);
        if (n>=0 && n<16) {
            if (shift==0) {
                word= typename std::iterator_traits<P2>::value_type(n);
                shift+=4;
            }
            else {
                word<<=4;
                word|= n;
                shift+=4;
            }
            if (shift==sizeof(word)*8) {
                *o++= word;

                shift=0;
            }
        }
    }
    return o-first;
}